

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.h
# Opt level: O2

binarydata * __thiscall
NetworkDataType::serializedata<bool_const,bool_const,bool_const,bool_const>
          (binarydata *__return_storage_ptr__,NetworkDataType *this,bool *args,bool *args_1,
          bool *args_2,bool *args_3)

{
  PortableBinaryOutputArchive archive;
  ostringstream stream;
  string local_2d8;
  PortableBinaryOutputArchive local_2b8;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  local_2d8._M_dataplus._M_p._0_1_ =
       cereal::portable_binary_detail::is_little_endian()::test == '\x01';
  cereal::PortableBinaryOutputArchive::PortableBinaryOutputArchive
            (&local_2b8,(ostream *)local_1a8,(Options *)&local_2d8);
  cereal::OutputArchive<cereal::PortableBinaryOutputArchive,1u>::
  process<bool_const&,bool_const&,bool_const&,bool_const&>
            ((OutputArchive<cereal::PortableBinaryOutputArchive,1u> *)
             local_2b8.super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>.self,
             (bool *)this,args,args_1,args_2);
  std::__cxx11::stringbuf::str();
  binarydata::binarydata(__return_storage_ptr__,&local_2d8);
  std::__cxx11::string::~string((string *)&local_2d8);
  cereal::OutputArchive<cereal::PortableBinaryOutputArchive,_1U>::~OutputArchive
            (&local_2b8.super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

static binarydata serializedata(T & ... args){
        std::ostringstream stream;
        cereal::PortableBinaryOutputArchive archive(stream);
        archive(args...);
        return binarydata(stream.str());
    }